

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O0

bool flatbuffers::EqualByName(Type *a,Type *b)

{
  __type _Var1;
  __type local_1b;
  __type local_1a;
  Type *b_local;
  Type *a_local;
  
  if (a->base_type != b->base_type) {
    return false;
  }
  if (a->element != b->element) {
    return false;
  }
  if (a->struct_def != b->struct_def) {
    if (a->struct_def == (StructDef *)0x0) {
      return false;
    }
    if (b->struct_def == (StructDef *)0x0) {
      return false;
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            a->struct_def,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            b->struct_def);
    if (!_Var1) {
      return false;
    }
  }
  local_1a = true;
  if (a->enum_def != b->enum_def) {
    local_1b = false;
    if ((a->enum_def != (EnumDef *)0x0) && (local_1b = false, b->enum_def != (EnumDef *)0x0)) {
      local_1b = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)a->enum_def,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)b->enum_def);
    }
    local_1a = local_1b;
  }
  return local_1a;
}

Assistant:

inline bool EqualByName(const Type &a, const Type &b) {
  return a.base_type == b.base_type && a.element == b.element &&
         (a.struct_def == b.struct_def ||
          (a.struct_def != nullptr && b.struct_def != nullptr &&
           a.struct_def->name == b.struct_def->name)) &&
         (a.enum_def == b.enum_def ||
          (a.enum_def != nullptr && b.enum_def != nullptr &&
           a.enum_def->name == b.enum_def->name));
}